

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O3

int __thiscall Handle::cfunc(Handle *this)

{
  ulong uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = (this->
          super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
          ).bits;
  uVar2 = (ushort)(uVar1 >> 0x30);
  uVar4 = (uint)uVar2;
  if (uVar1 >> 0x33 != 0) {
    uVar5 = uVar2 - 7;
    if (4 < uVar5) {
      uVar4 = uVar4 - 0xb;
      if (uVar4 < 3) {
        return (uVar4 == 2) + 0xb;
      }
      return ((uVar4 & 0x7ffffffe) != 2) + 0xd;
    }
    if (uVar5 < 3) {
      return (uVar5 == 2) + 7;
    }
    return ((uVar5 & 6) != 2) + 9;
  }
  if (uVar1 >> 0x32 == 0) {
    iVar3 = 0;
    if (uVar1 >> 0x31 != 0) {
      iVar3 = 2 - (uint)(uVar4 - 1 < 2);
    }
    return iVar3;
  }
  uVar4 = uVar4 - 3;
  if (uVar4 < 3) {
    return (uVar4 == 2) + 3;
  }
  return ((uVar4 & 0x7ffffffe) != 2) + 5;
}

Assistant:

PBRT_CPU_GPU
    uint16_t Tag() const { return uint16_t((bits & tagMask) >> tagShift); }